

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# y4minput.c
# Opt level: O2

int y4m_input_open(y4m_input *y4m_ctx,FILE *file,char *skip_buffer,int num_skip,
                  aom_chroma_sample_position_t csp,int only_420)

{
  byte *__s1;
  byte *pbVar1;
  byte bVar2;
  int iVar3;
  int iVar4;
  uchar *__ptr;
  uchar *puVar5;
  code *pcVar6;
  sbyte sVar7;
  int *piVar8;
  y4m_input *pyVar9;
  size_t sVar10;
  char *pcVar11;
  int iVar12;
  size_t sVar13;
  int iVar14;
  long lVar15;
  byte *pbVar16;
  bool bVar17;
  size_t sStack_1a0;
  char tag_buffer [9];
  byte local_138 [264];
  
  if (0 < num_skip) {
    memcpy(tag_buffer,skip_buffer,(ulong)(uint)num_skip);
  }
  iVar3 = file_read(tag_buffer + num_skip,(long)(9 - num_skip),file);
  if (iVar3 == 0) {
    return -1;
  }
  iVar3 = bcmp("YUV4MPEG2",tag_buffer,9);
  if (iVar3 != 0) {
    pcVar11 = "Error parsing header: must start with %s\n";
LAB_00122f1b:
    fprintf(_stderr,pcVar11,"YUV4MPEG2");
    return -1;
  }
  iVar3 = file_read(tag_buffer,1,file);
  if ((iVar3 == 0) || (tag_buffer[0] != ' ')) {
    pcVar11 = "Error parsing header: space must follow %s\n";
    goto LAB_00122f1b;
  }
  y4m_ctx->pic_w = -1;
  y4m_ctx->pic_h = -1;
  y4m_ctx->fps_n = -1;
  y4m_ctx->par_n = 0;
  y4m_ctx->par_d = 0;
  y4m_ctx->interlace = '?';
  y4m_ctx->color_range = AOM_CR_STUDIO_RANGE;
  pcVar11 = y4m_ctx->chroma_type;
  builtin_strncpy(y4m_ctx->chroma_type,"420",4);
LAB_001229c5:
  do {
    iVar3 = file_read(local_138,1,file);
    if (iVar3 == 0) goto LAB_00123025;
    if (local_138[0] == 10) {
      local_138[0] = 0;
      bVar17 = true;
    }
    else {
      lVar15 = 1;
      if (local_138[0] == 0x20) goto LAB_001229c5;
      while( true ) {
        if (lVar15 == 0x100) {
          pcVar11 = "Error: Y4M header tags must be less than %lu characters\n";
          pbVar16 = (byte *)0x100;
          goto LAB_00122c41;
        }
        iVar3 = file_read(local_138 + lVar15,1,file);
        if (iVar3 == 0) goto LAB_00123025;
        bVar2 = local_138[lVar15];
        if ((bVar2 == 10) || (bVar2 == 0x20)) break;
        lVar15 = lVar15 + 1;
      }
      local_138[lVar15] = 0;
      bVar17 = bVar2 == 10;
    }
    pbVar1 = local_138;
switchD_00122a8e_caseD_42:
    while (pbVar16 = pbVar1, bVar2 = *pbVar16, bVar2 == 0x20) {
      pbVar1 = pbVar16 + 1;
    }
    if (bVar2 != 0) {
      __s1 = pbVar16 + 1;
      for (sVar10 = 0; (__s1[sVar10] & 0xdf) != 0; sVar10 = sVar10 + 1) {
      }
      pbVar1 = __s1 + sVar10;
      switch(bVar2) {
      case 0x41:
        piVar8 = &y4m_ctx->par_n;
        break;
      case 0x42:
      case 0x44:
      case 0x45:
      case 0x47:
        goto switchD_00122a8e_caseD_42;
      case 0x43:
        if (0x10 < (long)(sVar10 + 1)) goto LAB_00123025;
        memcpy(pcVar11,__s1,sVar10);
        y4m_ctx->chroma_type[sVar10] = '\0';
        goto switchD_00122a8e_caseD_42;
      case 0x46:
        piVar8 = &y4m_ctx->fps_n;
        break;
      case 0x48:
        pyVar9 = (y4m_input *)&y4m_ctx->pic_h;
        goto LAB_00122b99;
      case 0x49:
        y4m_ctx->interlace = *__s1;
        goto switchD_00122a8e_caseD_42;
      default:
        pyVar9 = y4m_ctx;
        if (bVar2 == 0x57) {
LAB_00122b99:
          iVar3 = __isoc99_sscanf(__s1,"%d",pyVar9);
          if (iVar3 != 1) goto LAB_00123025;
        }
        else if ((bVar2 == 0x58) && (iVar3 = strncmp((char *)__s1,"COLORRANGE=",0xb), iVar3 == 0)) {
          pbVar16 = pbVar16 + 0xc;
          iVar3 = strcmp((char *)pbVar16,"LIMITED");
          if (iVar3 != 0) {
            iVar3 = strcmp((char *)pbVar16,"FULL");
            if (iVar3 != 0) {
              pcVar11 = "Unknown color range value: %s\n";
LAB_00122c41:
              fprintf(_stderr,pcVar11,pbVar16);
              goto LAB_00123025;
            }
            y4m_ctx->color_range = AOM_CR_FULL_RANGE;
          }
        }
        goto switchD_00122a8e_caseD_42;
      }
      iVar3 = __isoc99_sscanf(__s1,"%d:%d",piVar8);
      if (iVar3 != 2) goto LAB_00123025;
      goto switchD_00122a8e_caseD_42;
    }
  } while (!bVar17);
  if (y4m_ctx->pic_w == -1) {
    pcVar11 = "Width field missing\n";
    sStack_1a0 = 0x14;
LAB_0012301c:
    fwrite(pcVar11,sStack_1a0,1,_stderr);
LAB_00123025:
    fprintf(_stderr,"Error parsing %s header.\n","YUV4MPEG2");
    return -1;
  }
  if (y4m_ctx->pic_h == -1) {
    pcVar11 = "Height field missing\n";
    sStack_1a0 = 0x15;
    goto LAB_0012301c;
  }
  if (y4m_ctx->fps_n == -1) {
    pcVar11 = "FPS field missing\n";
    sStack_1a0 = 0x12;
    goto LAB_0012301c;
  }
  if (y4m_ctx->interlace != 'p') {
    if (y4m_ctx->interlace != '?') {
      pcVar11 = "Input video is interlaced; Only progressive scan handled.\n";
      sStack_1a0 = 0x3a;
      goto LAB_001233b5;
    }
    fwrite("Warning: Input video interlacing format unknown; assuming progressive scan.\n",0x4c,1,
           _stderr);
  }
  if (csp == AOM_CSP_VERTICAL) {
    iVar3 = strcmp(pcVar11,"420mpeg2");
    if (iVar3 != 0) {
      pcVar11 = "Vertical chroma sample position only supported for 420mpeg2 input\n";
      sStack_1a0 = 0x42;
      goto LAB_001233b5;
    }
  }
  else if (csp == AOM_CSP_COLOCATED) {
    fwrite("Ignoring colocated chroma sample position for reading in Y4M\n",0x3d,1,_stderr);
  }
  y4m_ctx->aom_fmt = AOM_IMG_FMT_I420;
  y4m_ctx->bps = 0xc;
  y4m_ctx->bit_depth = 8;
  y4m_ctx->dst_buf = (uchar *)0x0;
  y4m_ctx->aux_buf = (uchar *)0x0;
  iVar3 = strcmp(pcVar11,"420");
  if (((iVar3 == 0) || (iVar3 = strcmp(pcVar11,"420jpeg"), iVar3 == 0)) ||
     (iVar3 = strcmp(pcVar11,"420mpeg2"), iVar3 == 0)) {
    y4m_ctx->src_c_dec_h = 2;
    y4m_ctx->src_c_dec_v = 2;
    y4m_ctx->dst_c_dec_h = 2;
    y4m_ctx->dst_c_dec_v = 2;
    iVar3 = y4m_ctx->pic_w;
    iVar12 = y4m_ctx->pic_h;
    iVar4 = 2;
    y4m_ctx->dst_buf_read_sz = (long)(iVar12 * iVar3 + ((iVar12 + 1) / 2) * ((iVar3 + 1) / 2) * 2);
    y4m_ctx->aux_buf_sz = 0;
    y4m_ctx->aux_buf_read_sz = 0;
    y4m_ctx->convert = y4m_convert_null;
    goto LAB_00122e7b;
  }
  iVar3 = strcmp(pcVar11,"420p10");
  if (iVar3 == 0) {
    y4m_ctx->src_c_dec_h = 2;
    y4m_ctx->src_c_dec_v = 2;
    y4m_ctx->dst_c_dec_h = 2;
    y4m_ctx->dst_c_dec_v = 2;
    iVar3 = y4m_ctx->pic_w;
    iVar12 = y4m_ctx->pic_h;
    iVar4 = 2;
    y4m_ctx->dst_buf_read_sz =
         (long)((iVar12 * iVar3 + ((iVar12 + 1) / 2) * ((iVar3 + 1) / 2) * 2) * 2);
    y4m_ctx->aux_buf_sz = 0;
    y4m_ctx->aux_buf_read_sz = 0;
    y4m_ctx->convert = y4m_convert_null;
    y4m_ctx->bit_depth = 10;
    y4m_ctx->aom_fmt = AOM_IMG_FMT_I42016;
    y4m_ctx->bps = 0xf;
    if (only_420 != 0) {
      pcVar11 = "Unsupported conversion from 420p10 to 420jpeg\n";
      goto LAB_001233b3;
    }
  }
  else {
    iVar3 = strcmp(pcVar11,"420p12");
    if (iVar3 != 0) {
      iVar3 = strcmp(pcVar11,"420paldv");
      if (iVar3 == 0) {
        y4m_ctx->src_c_dec_h = 2;
        y4m_ctx->src_c_dec_v = 2;
        y4m_ctx->dst_c_dec_h = 2;
        y4m_ctx->dst_c_dec_v = 2;
        iVar3 = y4m_ctx->pic_w;
        iVar12 = y4m_ctx->pic_h;
        y4m_ctx->dst_buf_read_sz = (long)(iVar12 * iVar3);
        iVar4 = ((iVar12 + 1) / 2) * ((iVar3 + 1) / 2);
        sVar10 = (size_t)(iVar4 * 3);
        y4m_ctx->aux_buf_sz = sVar10;
        y4m_ctx->aux_buf_read_sz = (long)(iVar4 * 2);
        pcVar6 = y4m_convert_42xpaldv_42xjpeg;
LAB_00123424:
        iVar4 = 2;
        y4m_ctx->convert = pcVar6;
      }
      else {
        iVar3 = strcmp(pcVar11,"422jpeg");
        if (iVar3 == 0) {
          y4m_ctx->src_c_dec_h = 2;
          y4m_ctx->src_c_dec_v = 1;
          y4m_ctx->dst_c_dec_h = 2;
          y4m_ctx->dst_c_dec_v = 2;
          iVar3 = y4m_ctx->pic_w;
          iVar12 = y4m_ctx->pic_h;
          y4m_ctx->dst_buf_read_sz = (long)(iVar12 * iVar3);
          sVar10 = (size_t)(((iVar3 + 1) / 2) * iVar12 * 2);
          y4m_ctx->aux_buf_read_sz = sVar10;
          y4m_ctx->aux_buf_sz = sVar10;
          pcVar6 = y4m_convert_422jpeg_420jpeg;
          goto LAB_00123424;
        }
        iVar3 = strcmp(pcVar11,"422");
        if (iVar3 == 0) {
          y4m_ctx->src_c_dec_h = 2;
          y4m_ctx->src_c_dec_v = 1;
          if (only_420 == 0) {
            y4m_ctx->aom_fmt = AOM_IMG_FMT_I422;
            y4m_ctx->bps = 0x10;
            y4m_ctx->dst_c_dec_h = 2;
            y4m_ctx->dst_c_dec_v = 1;
            iVar3 = y4m_ctx->pic_w;
            iVar12 = y4m_ctx->pic_h;
            iVar4 = 2;
            y4m_ctx->dst_buf_read_sz = (long)((iVar3 + ((iVar3 + 1) / 2) * 2) * iVar12);
            y4m_ctx->aux_buf_sz = 0;
            y4m_ctx->aux_buf_read_sz = 0;
            y4m_ctx->convert = y4m_convert_null;
            sVar10 = 0;
            sVar7 = 0;
            iVar14 = 1;
            goto LAB_00122e82;
          }
          y4m_ctx->dst_c_dec_h = 2;
          y4m_ctx->dst_c_dec_v = 2;
          iVar3 = y4m_ctx->pic_w;
          iVar12 = y4m_ctx->pic_h;
          y4m_ctx->dst_buf_read_sz = (long)(iVar12 * iVar3);
          iVar4 = ((iVar3 + 1) / 2) * iVar12;
          sVar13 = (size_t)(iVar4 * 2);
          y4m_ctx->aux_buf_read_sz = sVar13;
          sVar10 = (long)iVar4 + sVar13;
          y4m_ctx->aux_buf_sz = sVar10;
          pcVar6 = y4m_convert_422_420jpeg;
          goto LAB_00123424;
        }
        iVar3 = strcmp(pcVar11,"422p10");
        if (iVar3 == 0) {
          y4m_ctx->aom_fmt = AOM_IMG_FMT_I42216;
          y4m_ctx->bps = 0x14;
          y4m_ctx->bit_depth = 10;
          y4m_ctx->src_c_dec_h = 2;
          y4m_ctx->src_c_dec_v = 1;
          y4m_ctx->dst_c_dec_h = 2;
          y4m_ctx->dst_c_dec_v = 1;
          iVar3 = y4m_ctx->pic_w;
          iVar12 = y4m_ctx->pic_h;
          y4m_ctx->dst_buf_read_sz = (long)((iVar3 + ((iVar3 + 1) / 2) * 2) * iVar12 * 2);
          y4m_ctx->aux_buf_sz = 0;
          y4m_ctx->aux_buf_read_sz = 0;
          y4m_ctx->convert = y4m_convert_null;
          if (only_420 == 0) {
LAB_001232ed:
            iVar4 = 2;
            sVar7 = 1;
            sVar10 = 0;
            iVar14 = 1;
            goto LAB_00122e82;
          }
          pcVar11 = "Unsupported conversion from 422p10 to 420jpeg\n";
LAB_001233b3:
          sStack_1a0 = 0x2e;
LAB_001233b5:
          fwrite(pcVar11,sStack_1a0,1,_stderr);
          return -1;
        }
        iVar3 = strcmp(pcVar11,"422p12");
        if (iVar3 == 0) {
          y4m_ctx->aom_fmt = AOM_IMG_FMT_I42216;
          y4m_ctx->bps = 0x18;
          y4m_ctx->bit_depth = 0xc;
          y4m_ctx->src_c_dec_h = 2;
          y4m_ctx->src_c_dec_v = 1;
          y4m_ctx->dst_c_dec_h = 2;
          y4m_ctx->dst_c_dec_v = 1;
          iVar3 = y4m_ctx->pic_w;
          iVar12 = y4m_ctx->pic_h;
          y4m_ctx->dst_buf_read_sz = (long)((iVar3 + ((iVar3 + 1) / 2) * 2) * iVar12 * 2);
          y4m_ctx->aux_buf_sz = 0;
          y4m_ctx->aux_buf_read_sz = 0;
          y4m_ctx->convert = y4m_convert_null;
          if (only_420 == 0) goto LAB_001232ed;
          pcVar11 = "Unsupported conversion from 422p12 to 420jpeg\n";
          goto LAB_001233b3;
        }
        iVar3 = strcmp(pcVar11,"411");
        if (iVar3 == 0) {
          y4m_ctx->src_c_dec_h = 4;
          y4m_ctx->src_c_dec_v = 1;
          y4m_ctx->dst_c_dec_h = 2;
          y4m_ctx->dst_c_dec_v = 2;
          iVar3 = y4m_ctx->pic_w;
          iVar12 = y4m_ctx->pic_h;
          y4m_ctx->dst_buf_read_sz = (long)(iVar12 * iVar3);
          sVar13 = (size_t)(((iVar3 + 3) / 4) * iVar12 * 2);
          y4m_ctx->aux_buf_read_sz = sVar13;
          sVar10 = (long)(((iVar3 + 1) / 2) * iVar12) + sVar13;
          y4m_ctx->aux_buf_sz = sVar10;
          pcVar6 = y4m_convert_411_420jpeg;
          goto LAB_00123424;
        }
        iVar3 = strcmp(pcVar11,"444");
        if (iVar3 != 0) {
          iVar3 = strcmp(pcVar11,"444p10");
          if (iVar3 == 0) {
            y4m_ctx->aom_fmt = AOM_IMG_FMT_I44416;
            y4m_ctx->bps = 0x1e;
            y4m_ctx->bit_depth = 10;
            y4m_ctx->src_c_dec_h = 1;
            y4m_ctx->src_c_dec_v = 1;
            y4m_ctx->dst_c_dec_h = 1;
            y4m_ctx->dst_c_dec_v = 1;
            iVar3 = y4m_ctx->pic_w;
            iVar12 = y4m_ctx->pic_h;
            y4m_ctx->dst_buf_read_sz = (long)(iVar3 * iVar12 * 6);
            y4m_ctx->aux_buf_sz = 0;
            y4m_ctx->aux_buf_read_sz = 0;
            y4m_ctx->convert = y4m_convert_null;
            if (only_420 != 0) {
              pcVar11 = "Unsupported conversion from 444p10 to 420jpeg\n";
              goto LAB_001233b3;
            }
          }
          else {
            iVar3 = strcmp(pcVar11,"444p12");
            if (iVar3 != 0) {
              iVar3 = strcmp(pcVar11,"444alpha");
              if (iVar3 != 0) {
                iVar3 = strcmp(pcVar11,"mono");
                if (iVar3 != 0) {
                  fprintf(_stderr,"Unknown chroma sampling type: %s\n",pcVar11);
                  return -1;
                }
                y4m_ctx->src_c_dec_h = 0;
                y4m_ctx->src_c_dec_v = 0;
                y4m_ctx->dst_c_dec_h = 2;
                y4m_ctx->dst_c_dec_v = 2;
                iVar3 = y4m_ctx->pic_w;
                iVar12 = y4m_ctx->pic_h;
                y4m_ctx->dst_buf_read_sz = (long)(iVar12 * iVar3);
                y4m_ctx->aux_buf_sz = 0;
                y4m_ctx->aux_buf_read_sz = 0;
                y4m_ctx->convert = y4m_convert_mono_420jpeg;
                iVar4 = 2;
                goto LAB_00122e7b;
              }
              y4m_ctx->src_c_dec_h = 1;
              y4m_ctx->src_c_dec_v = 1;
              if (only_420 == 0) {
                pcVar11 = "Unsupported format: 444A\n";
                sStack_1a0 = 0x19;
                goto LAB_001233b5;
              }
              y4m_ctx->dst_c_dec_h = 2;
              y4m_ctx->dst_c_dec_v = 2;
              iVar3 = y4m_ctx->pic_w;
              iVar12 = y4m_ctx->pic_h;
              y4m_ctx->dst_buf_read_sz = (long)(iVar12 * iVar3);
              sVar10 = (size_t)(iVar12 * iVar3 * 3);
              y4m_ctx->aux_buf_read_sz = sVar10;
              y4m_ctx->aux_buf_sz = sVar10;
              y4m_ctx->convert = y4m_convert_444_420jpeg;
              iVar4 = 2;
              goto LAB_00122e7d;
            }
            y4m_ctx->aom_fmt = AOM_IMG_FMT_I44416;
            y4m_ctx->bps = 0x24;
            y4m_ctx->bit_depth = 0xc;
            y4m_ctx->src_c_dec_h = 1;
            y4m_ctx->src_c_dec_v = 1;
            y4m_ctx->dst_c_dec_h = 1;
            y4m_ctx->dst_c_dec_v = 1;
            iVar3 = y4m_ctx->pic_w;
            iVar12 = y4m_ctx->pic_h;
            y4m_ctx->dst_buf_read_sz = (long)(iVar3 * iVar12 * 6);
            y4m_ctx->aux_buf_sz = 0;
            y4m_ctx->aux_buf_read_sz = 0;
            y4m_ctx->convert = y4m_convert_null;
            if (only_420 != 0) {
              pcVar11 = "Unsupported conversion from 444p12 to 420jpeg\n";
              goto LAB_001233b3;
            }
          }
          iVar4 = 1;
          goto LAB_001230fd;
        }
        y4m_ctx->src_c_dec_h = 1;
        y4m_ctx->src_c_dec_v = 1;
        if (only_420 != 0) {
          y4m_ctx->dst_c_dec_h = 2;
          y4m_ctx->dst_c_dec_v = 2;
          iVar3 = y4m_ctx->pic_w;
          iVar12 = y4m_ctx->pic_h;
          y4m_ctx->dst_buf_read_sz = (long)(iVar12 * iVar3);
          sVar13 = (size_t)(iVar12 * iVar3 * 2);
          y4m_ctx->aux_buf_read_sz = sVar13;
          sVar10 = (long)(((iVar3 + 1) / 2) * iVar12) + sVar13;
          y4m_ctx->aux_buf_sz = sVar10;
          pcVar6 = y4m_convert_444_420jpeg;
          goto LAB_00123424;
        }
        y4m_ctx->aom_fmt = AOM_IMG_FMT_I444;
        y4m_ctx->bps = 0x18;
        y4m_ctx->dst_c_dec_h = 1;
        y4m_ctx->dst_c_dec_v = 1;
        iVar3 = y4m_ctx->pic_w;
        iVar12 = y4m_ctx->pic_h;
        y4m_ctx->dst_buf_read_sz = (long)(iVar3 * iVar12 * 3);
        y4m_ctx->aux_buf_sz = 0;
        y4m_ctx->aux_buf_read_sz = 0;
        y4m_ctx->convert = y4m_convert_null;
        iVar4 = 1;
LAB_00122e7b:
        sVar10 = 0;
      }
LAB_00122e7d:
      sVar7 = 0;
      iVar14 = iVar4;
      goto LAB_00122e82;
    }
    y4m_ctx->src_c_dec_h = 2;
    y4m_ctx->src_c_dec_v = 2;
    y4m_ctx->dst_c_dec_h = 2;
    y4m_ctx->dst_c_dec_v = 2;
    iVar3 = y4m_ctx->pic_w;
    iVar12 = y4m_ctx->pic_h;
    iVar4 = 2;
    y4m_ctx->dst_buf_read_sz =
         (long)((iVar12 * iVar3 + ((iVar12 + 1) / 2) * ((iVar3 + 1) / 2) * 2) * 2);
    y4m_ctx->aux_buf_sz = 0;
    y4m_ctx->aux_buf_read_sz = 0;
    y4m_ctx->convert = y4m_convert_null;
    y4m_ctx->bit_depth = 0xc;
    y4m_ctx->aom_fmt = AOM_IMG_FMT_I42016;
    y4m_ctx->bps = 0x12;
    if (only_420 != 0) {
      pcVar11 = "Unsupported conversion from 420p12 to 420jpeg\n";
      goto LAB_001233b3;
    }
  }
LAB_001230fd:
  sVar7 = 1;
  sVar10 = 0;
  iVar14 = iVar4;
LAB_00122e82:
  sVar13 = (size_t)(iVar12 * iVar3 +
                   ((iVar12 + iVar14 + -1) / iVar14) * ((iVar3 + iVar4 + -1) / iVar4) * 2);
  y4m_ctx->dst_buf_sz = sVar13;
  __ptr = (uchar *)malloc(sVar13 << sVar7);
  y4m_ctx->dst_buf = __ptr;
  if (__ptr != (uchar *)0x0) {
    if (sVar10 == 0) {
      return 0;
    }
    puVar5 = (uchar *)malloc(sVar10);
    y4m_ctx->aux_buf = puVar5;
    if (puVar5 != (uchar *)0x0) {
      return 0;
    }
    free(__ptr);
  }
  return -1;
}

Assistant:

int y4m_input_open(y4m_input *y4m_ctx, FILE *file, char *skip_buffer,
                   int num_skip, aom_chroma_sample_position_t csp,
                   int only_420) {
  // File must start with |TAG|.
  char tag_buffer[9];  // 9 == strlen(TAG)
  // Read as much as possible from |skip_buffer|, which were characters
  // that were previously read from the file to do input-type detection.
  assert(num_skip >= 0 && num_skip <= 8);
  if (num_skip > 0) {
    memcpy(tag_buffer, skip_buffer, num_skip);
  }
  // Start reading from the file now that the |skip_buffer| is depleted.
  if (!file_read(tag_buffer + num_skip, 9 - num_skip, file)) {
    return -1;
  }
  if (memcmp(TAG, tag_buffer, 9) != 0) {
    fprintf(stderr, "Error parsing header: must start with %s\n", TAG);
    return -1;
  }
  // Next character must be a space.
  if (!file_read(tag_buffer, 1, file) || tag_buffer[0] != ' ') {
    fprintf(stderr, "Error parsing header: space must follow %s\n", TAG);
    return -1;
  }
  if (!parse_tags(y4m_ctx, file)) {
    fprintf(stderr, "Error parsing %s header.\n", TAG);
    return -1;
  }
  if (y4m_ctx->interlace == '?') {
    fprintf(stderr,
            "Warning: Input video interlacing format unknown; "
            "assuming progressive scan.\n");
  } else if (y4m_ctx->interlace != 'p') {
    fprintf(stderr,
            "Input video is interlaced; "
            "Only progressive scan handled.\n");
    return -1;
  }
  /* Only support vertical chroma sample position if the input format is
   * already 420mpeg2. Colocated is not supported in Y4M.
   */
  if (csp == AOM_CSP_VERTICAL &&
      strcmp(y4m_ctx->chroma_type, "420mpeg2") != 0) {
    fprintf(stderr,
            "Vertical chroma sample position only supported "
            "for 420mpeg2 input\n");
    return -1;
  }
  if (csp == AOM_CSP_COLOCATED) {
    // TODO(any): check the right way to handle this in y4m
    fprintf(stderr,
            "Ignoring colocated chroma sample position for reading in Y4M\n");
  }
  y4m_ctx->aom_fmt = AOM_IMG_FMT_I420;
  y4m_ctx->bps = 12;
  y4m_ctx->bit_depth = 8;
  y4m_ctx->aux_buf = NULL;
  y4m_ctx->dst_buf = NULL;
  if (strcmp(y4m_ctx->chroma_type, "420") == 0 ||
      strcmp(y4m_ctx->chroma_type, "420jpeg") == 0 ||
      strcmp(y4m_ctx->chroma_type, "420mpeg2") == 0) {
    y4m_ctx->src_c_dec_h = y4m_ctx->dst_c_dec_h = y4m_ctx->src_c_dec_v =
        y4m_ctx->dst_c_dec_v = 2;
    y4m_ctx->dst_buf_read_sz =
        y4m_ctx->pic_w * y4m_ctx->pic_h +
        2 * ((y4m_ctx->pic_w + 1) / 2) * ((y4m_ctx->pic_h + 1) / 2);
    /* Natively supported: no conversion required. */
    y4m_ctx->aux_buf_sz = y4m_ctx->aux_buf_read_sz = 0;
    y4m_ctx->convert = y4m_convert_null;
  } else if (strcmp(y4m_ctx->chroma_type, "420p10") == 0) {
    y4m_ctx->src_c_dec_h = 2;
    y4m_ctx->dst_c_dec_h = 2;
    y4m_ctx->src_c_dec_v = 2;
    y4m_ctx->dst_c_dec_v = 2;
    y4m_ctx->dst_buf_read_sz =
        2 * (y4m_ctx->pic_w * y4m_ctx->pic_h +
             2 * ((y4m_ctx->pic_w + 1) / 2) * ((y4m_ctx->pic_h + 1) / 2));
    /* Natively supported: no conversion required. */
    y4m_ctx->aux_buf_sz = y4m_ctx->aux_buf_read_sz = 0;
    y4m_ctx->convert = y4m_convert_null;
    y4m_ctx->bit_depth = 10;
    y4m_ctx->bps = 15;
    y4m_ctx->aom_fmt = AOM_IMG_FMT_I42016;
    if (only_420) {
      fprintf(stderr, "Unsupported conversion from 420p10 to 420jpeg\n");
      return -1;
    }
  } else if (strcmp(y4m_ctx->chroma_type, "420p12") == 0) {
    y4m_ctx->src_c_dec_h = 2;
    y4m_ctx->dst_c_dec_h = 2;
    y4m_ctx->src_c_dec_v = 2;
    y4m_ctx->dst_c_dec_v = 2;
    y4m_ctx->dst_buf_read_sz =
        2 * (y4m_ctx->pic_w * y4m_ctx->pic_h +
             2 * ((y4m_ctx->pic_w + 1) / 2) * ((y4m_ctx->pic_h + 1) / 2));
    /* Natively supported: no conversion required. */
    y4m_ctx->aux_buf_sz = y4m_ctx->aux_buf_read_sz = 0;
    y4m_ctx->convert = y4m_convert_null;
    y4m_ctx->bit_depth = 12;
    y4m_ctx->bps = 18;
    y4m_ctx->aom_fmt = AOM_IMG_FMT_I42016;
    if (only_420) {
      fprintf(stderr, "Unsupported conversion from 420p12 to 420jpeg\n");
      return -1;
    }
  } else if (strcmp(y4m_ctx->chroma_type, "420paldv") == 0) {
    y4m_ctx->src_c_dec_h = y4m_ctx->dst_c_dec_h = y4m_ctx->src_c_dec_v =
        y4m_ctx->dst_c_dec_v = 2;
    y4m_ctx->dst_buf_read_sz = y4m_ctx->pic_w * y4m_ctx->pic_h;
    /*Chroma filter required: read into the aux buf first.
      We need to make two filter passes, so we need some extra space in the
       aux buffer.*/
    y4m_ctx->aux_buf_sz =
        3 * ((y4m_ctx->pic_w + 1) / 2) * ((y4m_ctx->pic_h + 1) / 2);
    y4m_ctx->aux_buf_read_sz =
        2 * ((y4m_ctx->pic_w + 1) / 2) * ((y4m_ctx->pic_h + 1) / 2);
    y4m_ctx->convert = y4m_convert_42xpaldv_42xjpeg;
  } else if (strcmp(y4m_ctx->chroma_type, "422jpeg") == 0) {
    y4m_ctx->src_c_dec_h = y4m_ctx->dst_c_dec_h = 2;
    y4m_ctx->src_c_dec_v = 1;
    y4m_ctx->dst_c_dec_v = 2;
    y4m_ctx->dst_buf_read_sz = y4m_ctx->pic_w * y4m_ctx->pic_h;
    /*Chroma filter required: read into the aux buf first.*/
    y4m_ctx->aux_buf_sz = y4m_ctx->aux_buf_read_sz =
        2 * ((y4m_ctx->pic_w + 1) / 2) * y4m_ctx->pic_h;
    y4m_ctx->convert = y4m_convert_422jpeg_420jpeg;
  } else if (strcmp(y4m_ctx->chroma_type, "422") == 0) {
    y4m_ctx->src_c_dec_h = 2;
    y4m_ctx->src_c_dec_v = 1;
    if (only_420) {
      y4m_ctx->dst_c_dec_h = 2;
      y4m_ctx->dst_c_dec_v = 2;
      y4m_ctx->dst_buf_read_sz = y4m_ctx->pic_w * y4m_ctx->pic_h;
      /*Chroma filter required: read into the aux buf first.
        We need to make two filter passes, so we need some extra space in the
         aux buffer.*/
      y4m_ctx->aux_buf_read_sz =
          2 * ((y4m_ctx->pic_w + 1) / 2) * y4m_ctx->pic_h;
      y4m_ctx->aux_buf_sz = y4m_ctx->aux_buf_read_sz +
                            ((y4m_ctx->pic_w + 1) / 2) * y4m_ctx->pic_h;
      y4m_ctx->convert = y4m_convert_422_420jpeg;
    } else {
      y4m_ctx->aom_fmt = AOM_IMG_FMT_I422;
      y4m_ctx->bps = 16;
      y4m_ctx->dst_c_dec_h = y4m_ctx->src_c_dec_h;
      y4m_ctx->dst_c_dec_v = y4m_ctx->src_c_dec_v;
      y4m_ctx->dst_buf_read_sz =
          y4m_ctx->pic_w * y4m_ctx->pic_h +
          2 * ((y4m_ctx->pic_w + 1) / 2) * y4m_ctx->pic_h;
      /*Natively supported: no conversion required.*/
      y4m_ctx->aux_buf_sz = y4m_ctx->aux_buf_read_sz = 0;
      y4m_ctx->convert = y4m_convert_null;
    }
  } else if (strcmp(y4m_ctx->chroma_type, "422p10") == 0) {
    y4m_ctx->src_c_dec_h = 2;
    y4m_ctx->src_c_dec_v = 1;
    y4m_ctx->aom_fmt = AOM_IMG_FMT_I42216;
    y4m_ctx->bps = 20;
    y4m_ctx->bit_depth = 10;
    y4m_ctx->dst_c_dec_h = y4m_ctx->src_c_dec_h;
    y4m_ctx->dst_c_dec_v = y4m_ctx->src_c_dec_v;
    y4m_ctx->dst_buf_read_sz =
        2 * (y4m_ctx->pic_w * y4m_ctx->pic_h +
             2 * ((y4m_ctx->pic_w + 1) / 2) * y4m_ctx->pic_h);
    y4m_ctx->aux_buf_sz = y4m_ctx->aux_buf_read_sz = 0;
    y4m_ctx->convert = y4m_convert_null;
    if (only_420) {
      fprintf(stderr, "Unsupported conversion from 422p10 to 420jpeg\n");
      return -1;
    }
  } else if (strcmp(y4m_ctx->chroma_type, "422p12") == 0) {
    y4m_ctx->src_c_dec_h = 2;
    y4m_ctx->src_c_dec_v = 1;
    y4m_ctx->aom_fmt = AOM_IMG_FMT_I42216;
    y4m_ctx->bps = 24;
    y4m_ctx->bit_depth = 12;
    y4m_ctx->dst_c_dec_h = y4m_ctx->src_c_dec_h;
    y4m_ctx->dst_c_dec_v = y4m_ctx->src_c_dec_v;
    y4m_ctx->dst_buf_read_sz =
        2 * (y4m_ctx->pic_w * y4m_ctx->pic_h +
             2 * ((y4m_ctx->pic_w + 1) / 2) * y4m_ctx->pic_h);
    y4m_ctx->aux_buf_sz = y4m_ctx->aux_buf_read_sz = 0;
    y4m_ctx->convert = y4m_convert_null;
    if (only_420) {
      fprintf(stderr, "Unsupported conversion from 422p12 to 420jpeg\n");
      return -1;
    }
  } else if (strcmp(y4m_ctx->chroma_type, "411") == 0) {
    y4m_ctx->src_c_dec_h = 4;
    y4m_ctx->dst_c_dec_h = 2;
    y4m_ctx->src_c_dec_v = 1;
    y4m_ctx->dst_c_dec_v = 2;
    y4m_ctx->dst_buf_read_sz = y4m_ctx->pic_w * y4m_ctx->pic_h;
    /*Chroma filter required: read into the aux buf first.
      We need to make two filter passes, so we need some extra space in the
       aux buffer.*/
    y4m_ctx->aux_buf_read_sz = 2 * ((y4m_ctx->pic_w + 3) / 4) * y4m_ctx->pic_h;
    y4m_ctx->aux_buf_sz =
        y4m_ctx->aux_buf_read_sz + ((y4m_ctx->pic_w + 1) / 2) * y4m_ctx->pic_h;
    y4m_ctx->convert = y4m_convert_411_420jpeg;
  } else if (strcmp(y4m_ctx->chroma_type, "444") == 0) {
    y4m_ctx->src_c_dec_h = 1;
    y4m_ctx->src_c_dec_v = 1;
    if (only_420) {
      y4m_ctx->dst_c_dec_h = 2;
      y4m_ctx->dst_c_dec_v = 2;
      y4m_ctx->dst_buf_read_sz = y4m_ctx->pic_w * y4m_ctx->pic_h;
      /*Chroma filter required: read into the aux buf first.
        We need to make two filter passes, so we need some extra space in the
         aux buffer.*/
      y4m_ctx->aux_buf_read_sz = 2 * y4m_ctx->pic_w * y4m_ctx->pic_h;
      y4m_ctx->aux_buf_sz = y4m_ctx->aux_buf_read_sz +
                            ((y4m_ctx->pic_w + 1) / 2) * y4m_ctx->pic_h;
      y4m_ctx->convert = y4m_convert_444_420jpeg;
    } else {
      y4m_ctx->aom_fmt = AOM_IMG_FMT_I444;
      y4m_ctx->bps = 24;
      y4m_ctx->dst_c_dec_h = y4m_ctx->src_c_dec_h;
      y4m_ctx->dst_c_dec_v = y4m_ctx->src_c_dec_v;
      y4m_ctx->dst_buf_read_sz = 3 * y4m_ctx->pic_w * y4m_ctx->pic_h;
      /*Natively supported: no conversion required.*/
      y4m_ctx->aux_buf_sz = y4m_ctx->aux_buf_read_sz = 0;
      y4m_ctx->convert = y4m_convert_null;
    }
  } else if (strcmp(y4m_ctx->chroma_type, "444p10") == 0) {
    y4m_ctx->src_c_dec_h = 1;
    y4m_ctx->src_c_dec_v = 1;
    y4m_ctx->aom_fmt = AOM_IMG_FMT_I44416;
    y4m_ctx->bps = 30;
    y4m_ctx->bit_depth = 10;
    y4m_ctx->dst_c_dec_h = y4m_ctx->src_c_dec_h;
    y4m_ctx->dst_c_dec_v = y4m_ctx->src_c_dec_v;
    y4m_ctx->dst_buf_read_sz = 2 * 3 * y4m_ctx->pic_w * y4m_ctx->pic_h;
    y4m_ctx->aux_buf_sz = y4m_ctx->aux_buf_read_sz = 0;
    y4m_ctx->convert = y4m_convert_null;
    if (only_420) {
      fprintf(stderr, "Unsupported conversion from 444p10 to 420jpeg\n");
      return -1;
    }
  } else if (strcmp(y4m_ctx->chroma_type, "444p12") == 0) {
    y4m_ctx->src_c_dec_h = 1;
    y4m_ctx->src_c_dec_v = 1;
    y4m_ctx->aom_fmt = AOM_IMG_FMT_I44416;
    y4m_ctx->bps = 36;
    y4m_ctx->bit_depth = 12;
    y4m_ctx->dst_c_dec_h = y4m_ctx->src_c_dec_h;
    y4m_ctx->dst_c_dec_v = y4m_ctx->src_c_dec_v;
    y4m_ctx->dst_buf_read_sz = 2 * 3 * y4m_ctx->pic_w * y4m_ctx->pic_h;
    y4m_ctx->aux_buf_sz = y4m_ctx->aux_buf_read_sz = 0;
    y4m_ctx->convert = y4m_convert_null;
    if (only_420) {
      fprintf(stderr, "Unsupported conversion from 444p12 to 420jpeg\n");
      return -1;
    }
  } else if (strcmp(y4m_ctx->chroma_type, "444alpha") == 0) {
    y4m_ctx->src_c_dec_h = 1;
    y4m_ctx->src_c_dec_v = 1;
    if (only_420) {
      y4m_ctx->dst_c_dec_h = 2;
      y4m_ctx->dst_c_dec_v = 2;
      y4m_ctx->dst_buf_read_sz = y4m_ctx->pic_w * y4m_ctx->pic_h;
      /*Chroma filter required: read into the aux buf first.
        We need to make two filter passes, so we need some extra space in the
         aux buffer.
        The extra plane also gets read into the aux buf.
        It will be discarded.*/
      y4m_ctx->aux_buf_sz = y4m_ctx->aux_buf_read_sz =
          3 * y4m_ctx->pic_w * y4m_ctx->pic_h;
      y4m_ctx->convert = y4m_convert_444_420jpeg;
    } else {
      fprintf(stderr, "Unsupported format: 444A\n");
      return -1;
    }
  } else if (strcmp(y4m_ctx->chroma_type, "mono") == 0) {
    y4m_ctx->src_c_dec_h = y4m_ctx->src_c_dec_v = 0;
    y4m_ctx->dst_c_dec_h = y4m_ctx->dst_c_dec_v = 2;
    y4m_ctx->dst_buf_read_sz = y4m_ctx->pic_w * y4m_ctx->pic_h;
    /*No extra space required, but we need to clear the chroma planes.*/
    y4m_ctx->aux_buf_sz = y4m_ctx->aux_buf_read_sz = 0;
    y4m_ctx->convert = y4m_convert_mono_420jpeg;
  } else {
    fprintf(stderr, "Unknown chroma sampling type: %s\n", y4m_ctx->chroma_type);
    return -1;
  }
  /*The size of the final frame buffers is always computed from the
     destination chroma decimation type.*/
  y4m_ctx->dst_buf_sz =
      y4m_ctx->pic_w * y4m_ctx->pic_h +
      2 * ((y4m_ctx->pic_w + y4m_ctx->dst_c_dec_h - 1) / y4m_ctx->dst_c_dec_h) *
          ((y4m_ctx->pic_h + y4m_ctx->dst_c_dec_v - 1) / y4m_ctx->dst_c_dec_v);
  if (y4m_ctx->bit_depth == 8)
    y4m_ctx->dst_buf = (unsigned char *)malloc(y4m_ctx->dst_buf_sz);
  else
    y4m_ctx->dst_buf = (unsigned char *)malloc(2 * y4m_ctx->dst_buf_sz);
  if (!y4m_ctx->dst_buf) return -1;

  if (y4m_ctx->aux_buf_sz > 0) {
    y4m_ctx->aux_buf = (unsigned char *)malloc(y4m_ctx->aux_buf_sz);
    if (!y4m_ctx->aux_buf) {
      free(y4m_ctx->dst_buf);
      return -1;
    }
  }
  return 0;
}